

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::TexelBufferDescriptorCase::
genResourceAccessSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  char *__s;
  char *__s_00;
  char *__s_01;
  ostringstream buf;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  iVar1 = *(int *)((long)this + 0x88);
  if (iVar1 == 0) {
    __s = "";
    __s_00 = "";
  }
  else if (iVar1 == 1) {
    __s = "A";
    __s_00 = "B";
  }
  else {
    __s = "[0]";
    if (iVar1 != 3) {
      __s = (char *)0x0;
    }
    __s_00 = "[1]";
    if (iVar1 != 3) {
      __s_00 = (char *)0x0;
    }
  }
  uVar2 = *(int *)((long)this + 0x84) - 4;
  if (uVar2 < 5) {
    __s_01 = &DAT_00aecb60 + *(int *)(&DAT_00aecb60 + (ulong)uVar2 * 4);
  }
  else {
    __s_01 = "imageLoad";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tif (quadrant_id == 0)\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\t\tresult_color = ",0x11);
  sVar3 = strlen(__s_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_01,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(u_texelBuffer",0xe);
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(local_1a8,6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\telse if (quadrant_id == 1)\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tresult_color = ",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_01,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(u_texelBuffer",0xe);
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar4 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_00,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x33);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\telse if (quadrant_id == 2)\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tresult_color = ",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_01,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(u_texelBuffer",0xe);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tresult_color = ",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_01,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(u_texelBuffer",0xe);
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar3 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_00,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string TexelBufferDescriptorCase::genResourceAccessSource (vk::VkShaderStageFlagBits stage) const
{
	DE_UNREF(stage);

	const char* const	accessPostfixA	= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)						? ("")
										: (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)		? ("A")
										: (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY)						? ("[0]")
										: (DE_NULL);
	const char* const	accessPostfixB	= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)						? ("")
										: (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)		? ("B")
										: (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY)						? ("[1]")
										: (DE_NULL);
	const char* const	fetchFunc		= (isUniformDescriptorType(m_descriptorType)) ? ("texelFetch") : ("imageLoad");
	std::ostringstream	buf;

	buf << "	if (quadrant_id == 0)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixA << ", " << TexelBufferInstanceBuffers::getFetchPos(0) << ");\n"
		<< "	else if (quadrant_id == 1)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixB << ", " << TexelBufferInstanceBuffers::getFetchPos(1) << ");\n"
		<< "	else if (quadrant_id == 2)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixA << ", " << TexelBufferInstanceBuffers::getFetchPos(2) << ");\n"
		<< "	else\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixB << ", " << TexelBufferInstanceBuffers::getFetchPos(3) << ");\n";

	return buf.str();
}